

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_simple.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  LIBSSH2_SESSION *session;
  ulong local_30;
  char *data;
  
  uVar1 = libssh2_init(1);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2_init() failed: %d\n",(ulong)uVar1);
    return 1;
  }
  session = libssh2_session_init_ex
                      ((_func_void_ptr_size_t_void_ptr_ptr *)0x0,
                       (_func_void_void_ptr_void_ptr_ptr *)0x0,
                       (_func_void_ptr_void_ptr_size_t_void_ptr_ptr *)0x0,(void *)0x0);
  if (session != (LIBSSH2_SESSION *)0x0) {
    iVar2 = _libssh2_base64_decode(session,&data,&local_30,"Zm5vcmQ=",8);
    if (iVar2 == 0) {
      if ((local_30 == 5) && (iVar2 = strcmp(data,"fnord"), iVar2 == 0)) {
        free(data);
      }
      else {
        fprintf(_stderr,"_libssh2_base64_decode() failed (%d, %.*s)\n",local_30 & 0xffffffff,
                local_30 & 0xffffffff,data);
      }
    }
    libssh2_session_free(session);
    libssh2_exit();
    return 0;
  }
  fwrite("libssh2_session_init() failed\n",0x1e,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    LIBSSH2_SESSION *session;
    int rc;
    (void)argv;
    (void)argc;

    rc = libssh2_init(LIBSSH2_INIT_NO_CRYPTO);
    if(rc) {
        fprintf(stderr, "libssh2_init() failed: %d\n", rc);
        return 1;
    }

    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "libssh2_session_init() failed\n");
        return 1;
    }

    test_libssh2_base64_decode(session);

    libssh2_session_free(session);

    libssh2_exit();

    return 0;
}